

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::vSolveRight4update2sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double eps2,double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2,double *forest,
          int *forestNum,int *forestIdx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_RCX;
  double in_RDI;
  int *in_R8;
  int *in_R9;
  double in_XMM0_Qa;
  int *unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  int *it;
  int *rperm;
  int *in_stack_00000020;
  int k;
  int j;
  int i;
  double x;
  double *eps_00;
  int *local_68;
  int local_50;
  int local_4c;
  undefined8 local_48;
  int *local_38;
  int *local_30;
  long local_28;
  double dVar5;
  
  eps_00 = _j;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  dVar5 = in_RDI;
  vSolveLright2((CLUFactor<double> *)rn,(double *)eps2,(int *)x,(int *)_j,(double)in_stack_00000020,
                (double *)rperm,it,(int *)rhs,(double)CONCAT44(in_stack_0000000c,in_stack_00000008))
  ;
  lVar1 = *(long *)((long)in_RDI + 0x40);
  if (x == 0.0) {
    local_50 = 0;
    for (local_4c = 0; local_4c < *local_38; local_4c = local_4c + 1) {
      iVar4 = local_30[local_4c];
      local_48 = *(undefined8 *)(local_28 + (long)iVar4 * 8);
      bVar2 = isNotZero<double,double>(in_RDI,(double)eps_00);
      if (bVar2) {
        enQueueMax(local_30,&local_50,*(int *)(lVar1 + (long)iVar4 * 4));
      }
      else {
        *(undefined8 *)(local_28 + (long)iVar4 * 8) = 0;
      }
    }
    *local_38 = local_50;
  }
  else {
    local_68 = rn;
    local_50 = 0;
    for (local_4c = 0; local_4c < *local_38; local_4c = local_4c + 1) {
      iVar4 = local_30[local_4c];
      local_48 = *(undefined8 *)(local_28 + (long)iVar4 * 8);
      bVar2 = isNotZero<double,double>(in_RDI,(double)eps_00);
      if (bVar2) {
        *local_68 = iVar4;
        enQueueMax(local_30,&local_50,*(int *)(lVar1 + (long)iVar4 * 4));
        *(undefined8 *)((long)x + (long)iVar4 * 8) = local_48;
        local_68 = local_68 + 1;
      }
      else {
        *(undefined8 *)(local_28 + (long)iVar4 * 8) = 0;
      }
    }
    *local_38 = local_50;
    *(int *)eps2 = local_50;
  }
  local_50 = 0;
  for (local_4c = 0; iVar4 = (int)((ulong)dVar5 >> 0x20), local_4c < *(int *)_j;
      local_4c = local_4c + 1) {
    iVar4 = in_stack_00000020[local_4c];
    local_48 = *(undefined8 *)(rperm + (long)iVar4 * 2);
    bVar2 = isNotZero<double,double>(in_RDI,(double)eps_00);
    if (bVar2) {
      enQueueMax(in_stack_00000020,&local_50,*(int *)(lVar1 + (long)iVar4 * 4));
    }
    else {
      (rperm + (long)iVar4 * 2)[0] = 0;
      (rperm + (long)iVar4 * 2)[1] = 0;
    }
  }
  *(int *)_j = local_50;
  iVar3 = vSolveUright((CLUFactor<double> *)x,_j,in_stack_00000020,(double *)rperm,it,
                       in_stack_0000000c,(double)unaff_retaddr);
  *local_38 = iVar3;
  iVar3 = vSolveUright((CLUFactor<double> *)x,_j,in_stack_00000020,(double *)rperm,it,
                       in_stack_0000000c,(double)unaff_retaddr);
  *(int *)_j = iVar3;
  if (*(int *)((long)in_RDI + 0xa0) == 0) {
    iVar3 = vSolveUpdateRight((CLUFactor<double> *)it,
                              (double *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                              iVar4,in_XMM0_Qa);
    *local_38 = iVar3;
    iVar4 = vSolveUpdateRight((CLUFactor<double> *)it,
                              (double *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                              iVar4,in_XMM0_Qa);
    *(int *)_j = iVar4;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}